

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O1

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,int p)

{
  *(undefined8 *)&(this->sa).super_type.m_storage.dummy_ = 0;
  *(undefined8 *)((long)&(this->sa).super_type.m_storage.dummy_ + 8) = 0;
  (this->sa).super_type.m_initialized = true;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->host,"0.0.0.0","");
  this->port = p;
  if ((this->sa).super_type.m_initialized != false) {
    *(undefined2 *)&(this->sa).super_type.m_storage.dummy_ = 2;
    *(ushort *)((long)&(this->sa).super_type.m_storage.dummy_ + 2) = (ushort)p << 8 | (ushort)p >> 8
    ;
    *(undefined4 *)((long)&(this->sa).super_type.m_storage.dummy_ + 4) = 0;
    return;
  }
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<sockaddr_in>::operator->() [T = sockaddr_in]");
}

Assistant:

Inet_addr::Impl::Impl( int p ):
  sa(SystemSockAddrIn()), host("0.0.0.0"), port(p)
{
  sa->sin_family = PF_INET;
  sa->sin_port = htons(port);
  sa->sin_addr.s_addr = INADDR_ANY;
}